

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O3

void __thiscall
vmips::Function::
call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
          (Function *this,weak_ptr<vmips::Function> *target,shared_ptr<vmips::VirtReg> *args,
          shared_ptr<vmips::VirtReg> *args_1,shared_ptr<vmips::VirtReg> *args_2)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Atomic_word _Var3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  initializer_list<std::shared_ptr<vmips::VirtReg>_> __l;
  shared_ptr<vmips::callfunc> calling;
  allocator_type local_92;
  undefined1 local_91;
  callfunc *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  shared_ptr<vmips::Instruction> local_80;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Function *local_50;
  void *local_48;
  vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  local_40;
  
  this[0x108] = (Function)0x1;
  p_Var2 = (target->super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  _Var3 = p_Var2->_M_use_count;
  do {
    LOCK();
    iVar1 = p_Var2->_M_use_count;
    bVar6 = _Var3 == iVar1;
    if (bVar6) {
      p_Var2->_M_use_count = _Var3 + 1;
      iVar1 = _Var3;
    }
    _Var3 = iVar1;
    UNLOCK();
  } while (!bVar6);
  uVar4 = *(ulong *)((target->super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    + 0x128);
  if (uVar4 < *(ulong *)(this + 0x110)) {
    uVar4 = *(ulong *)(this + 0x110);
  }
  *(ulong *)(this + 0x110) = uVar4;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  local_48 = (void *)0x0;
  local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(args->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_70 = (args_1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68 = (args_1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_68->_M_use_count = local_68->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_68->_M_use_count = local_68->_M_use_count + 1;
    }
  }
  local_60 = (args_2->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58 = (args_2->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = (iterator)&local_80;
  local_50 = this;
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  vector(&local_40,__l,&local_92);
  local_90 = (callfunc *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::callfunc,std::allocator<vmips::callfunc>,decltype(nullptr),vmips::Function*,std::weak_ptr<vmips::Function>,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>
            (&local_88,&local_90,(allocator<vmips::callfunc> *)&local_91,&local_48,&local_50,target,
             &local_40);
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  ~vector(&local_40);
  lVar5 = 0x30;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_88._M_pi + lVar5);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != 0);
  lVar5 = *(long *)(this + 0x148);
  local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90;
  local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_88._M_pi;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(lVar5 + 0x30),&local_80);
  if (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  return;
}

Assistant:

void call_void(std::weak_ptr<Function> target, Args &&... args) {
            has_sub = true;
            sub_argc = std::max(sub_argc, target.lock()->argc);
            auto calling = std::make_shared<callfunc>(nullptr, this, std::move(target),
                                                      std::vector<std::shared_ptr<VirtReg >>{
                                                              std::forward<Args>(args)...});
            cursor->instructions.push_back(calling);
        }